

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_Rectangle2D(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer pFVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  CX3DImporter_NodeElement_Geometry2D *pCVar6;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *plVar7;
  allocator local_109;
  string local_108;
  aiVector3t<float> local_e8;
  aiVector3t<float> local_dc;
  aiVector3t<float> local_d0;
  aiVector3t<float> local_c4;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_b8;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vlist;
  float y2;
  float y1;
  float x2;
  float x1;
  undefined1 local_98 [8];
  string an;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  bool solid;
  aiVector2t<float> local_58;
  aiVector2D size;
  string use;
  string def;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(use.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&size);
  aiVector2t<float>::aiVector2t(&local_58,2.0,2.0);
  ne._3_1_ = 0;
  _idx_end = (CX3DImporter_NodeElement_Geometry2D *)0x0;
  an.field_2._12_4_ = 0;
  pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  an.field_2._8_4_ =
       (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)an.field_2._12_4_ < (int)an.field_2._8_4_; an.field_2._12_4_ = an.field_2._12_4_ + 1)
  {
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar4,(ulong)(uint)an.field_2._12_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_98,(char *)CONCAT44(extraout_var,iVar2),(allocator *)((long)&x1 + 3))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&x1 + 3));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"DEF");
    if (bVar1) {
      pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar4,(ulong)(uint)an.field_2._12_4_);
      std::__cxx11::string::operator=
                ((string *)(use.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar2));
      x2 = 5.60519e-45;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_98,"USE");
      if (bVar1) {
        pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar4,(ulong)(uint)an.field_2._12_4_);
        std::__cxx11::string::operator=((string *)&size,(char *)CONCAT44(extraout_var_01,iVar2));
        x2 = 5.60519e-45;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_98,"bboxCenter");
        if (bVar1) {
          x2 = 5.60519e-45;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_98,"bboxSize");
          if (bVar1) {
            x2 = 5.60519e-45;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_98,"containerField");
            if (bVar1) {
              x2 = 5.60519e-45;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_98,"size");
              if (bVar1) {
                XML_ReadNode_GetAttrVal_AsVec2f(this,an.field_2._12_4_,&local_58);
                x2 = 5.60519e-45;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_98,"solid");
                if (bVar1) {
                  ne._3_1_ = XML_ReadNode_GetAttrVal_AsBool(this,an.field_2._12_4_);
                  x2 = 5.60519e-45;
                }
                else {
                  Throw_IncorrectAttr(this,(string *)local_98);
                  x2 = 0.0;
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_98);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)&size,ENET_Rectangle2D,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)&size);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    pCVar6 = (CX3DImporter_NodeElement_Geometry2D *)operator_new(0x78);
    CX3DImporter_NodeElement_Geometry2D::CX3DImporter_NodeElement_Geometry2D
              (pCVar6,ENET_Rectangle2D,this->NodeElement_Cur);
    _idx_end = pCVar6;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,
                 (string *)(use.field_2._M_local_buf + 8));
    }
    y1 = -local_58.x * 0.5;
    y2 = local_58.x * 0.5;
    vlist._4_4_ = -local_58.y * 0.5;
    vlist._0_4_ = local_58.y * 0.5;
    plVar7 = &_idx_end->Vertices;
    local_b8 = plVar7;
    aiVector3t<float>::aiVector3t(&local_c4,y2,vlist._4_4_,0.0);
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (plVar7,&local_c4);
    plVar7 = local_b8;
    aiVector3t<float>::aiVector3t(&local_d0,y2,vlist._0_4_,0.0);
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (plVar7,&local_d0);
    plVar7 = local_b8;
    aiVector3t<float>::aiVector3t(&local_dc,y1,vlist._0_4_,0.0);
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (plVar7,&local_dc);
    plVar7 = local_b8;
    aiVector3t<float>::aiVector3t(&local_e8,y1,vlist._4_4_,0.0);
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              (plVar7,&local_e8);
    _idx_end->Solid = (bool)(ne._3_1_ & 1);
    _idx_end->NumIndices = 4;
    pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar6 = _idx_end;
    if ((uVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_108,"Rectangle2D",&local_109);
      ParseNode_Metadata(this,&pCVar6->super_CX3DImporter_NodeElement,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::__cxx11::string::~string((string *)&size);
  std::__cxx11::string::~string((string *)(use.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_Rectangle2D()
{
    std::string def, use;
    aiVector2D size(2, 2);
    bool solid = false;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("size", size, XML_ReadNode_GetAttrVal_AsVec2f);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Rectangle2D, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_Rectangle2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		float x1 = -size.x / 2.0f;
		float x2 = size.x / 2.0f;
		float y1 = -size.y / 2.0f;
		float y2 = size.y / 2.0f;
		std::list<aiVector3D>& vlist = ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices;// just short alias.

		vlist.push_back(aiVector3D(x2, y1, 0));// 1st point
		vlist.push_back(aiVector3D(x2, y2, 0));// 2nd point
		vlist.push_back(aiVector3D(x1, y2, 0));// 3rd point
		vlist.push_back(aiVector3D(x1, y1, 0));// 4th point
		((CX3DImporter_NodeElement_Geometry2D*)ne)->Solid = solid;
		((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 4;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Rectangle2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}